

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Get(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *root,size_t *unresolvedTokenIndex)

{
  uint uVar1;
  ushort uVar2;
  SizeType SVar3;
  Token *pTVar4;
  long lVar5;
  Token *pTVar6;
  MemberIterator m;
  Data local_68;
  size_t *local_50;
  Number local_48;
  GenericStringRef<char> local_40;
  
  local_50 = unresolvedTokenIndex;
  if (this->parseErrorCode_ != kPointerParseErrorNone) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x25a,
                  "ValueType *rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Get(ValueType &, size_t *) const [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  pTVar4 = this->tokens_;
  lVar5 = -(long)pTVar4;
  pTVar6 = pTVar4;
  do {
    if (pTVar6 == pTVar4 + this->tokenCount_) {
      return root;
    }
    uVar2 = (root->data_).f.flags & 7;
    if (uVar2 == 4) {
      uVar1 = pTVar6->index;
      if ((uVar1 == 0xffffffff) ||
         (SVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::Size(root), SVar3 <= uVar1)) goto LAB_00146984;
      root = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](root,pTVar6->index);
    }
    else {
      if (uVar2 != 3) {
LAB_00146984:
        if (local_50 != (size_t *)0x0) {
          *local_50 = -((long)&this->tokens_->name + lVar5) >> 4;
        }
        return (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)0x0;
      }
      GenericStringRef<char>::GenericStringRef(&local_40,pTVar6->name,pTVar6->length);
      local_68.s.str = (Ch *)((ulong)local_40.s | 0x405000000000000);
      local_68.s.hashcode = 0;
      local_68.s.length = local_40.length;
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_48.i,root);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_68.s);
      if ((Number)local_48.i64 == local_68.n.i64) goto LAB_00146984;
      root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)(local_48.i64 + 0x10);
    }
    pTVar6 = pTVar6 + 1;
    pTVar4 = this->tokens_;
    lVar5 = lVar5 + -0x10;
  } while( true );
}

Assistant:

ValueType* Get(ValueType& root, size_t* unresolvedTokenIndex = 0) const {
        RAPIDJSON_ASSERT(IsValid());
        ValueType* v = &root;
        for (const Token *t = tokens_; t != tokens_ + tokenCount_; ++t) {
            switch (v->GetType()) {
            case kObjectType:
                {
                    typename ValueType::MemberIterator m = v->FindMember(GenericValue<EncodingType>(GenericStringRef<Ch>(t->name, t->length)));
                    if (m == v->MemberEnd())
                        break;
                    v = &m->value;
                }
                continue;
            case kArrayType:
                if (t->index == kPointerInvalidIndex || t->index >= v->Size())
                    break;
                v = &((*v)[t->index]);
                continue;
            default:
                break;
            }

            // Error: unresolved token
            if (unresolvedTokenIndex)
                *unresolvedTokenIndex = static_cast<size_t>(t - tokens_);
            return 0;
        }
        return v;
    }